

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::Scene(Scene *this,int tx,int ty,int tw,int th)

{
  time_t tVar1;
  Floor *this_00;
  Player *this_01;
  int th_local;
  int tw_local;
  int ty_local;
  int tx_local;
  Scene *this_local;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this->x = tx;
  this->y = ty;
  this->w = tw;
  this->h = th;
  this->isStop = true;
  this->isGameOver = false;
  this->score = 0;
  clearRect(this->x,this->y,this->w,this->h);
  drawWholeRect(this->x,this->y,this->w,this->h,7);
  this_00 = (Floor *)operator_new(0x30);
  Floor::Floor(this_00,this->x + 1,this->y + -5 + this->h,this->w + -2,4,2);
  this->floors = this_00;
  this_01 = (Player *)operator_new(0x38);
  Player::Player(this_01,this->x + 5,this->y + -6 + th);
  this->player = this_01;
  draw(this);
  return;
}

Assistant:

Scene::Scene(int tx, int ty, int tw, int th){
    srand(time(0));
    x = tx;
    y = ty;
    w = tw;
    h = th;
    isStop = 1;
    isGameOver = 0;
    score = 0;
    clearRect(x, y, w, h);
    drawWholeRect(x, y, w, h, WHITE);
    floors = new Floor(x+1, y+h-1-FLOORH, w-2, FLOORH, FLOORS);
    player = new Player(x+PLAYERX, y+th-1-FLOORH-1);
    draw();
}